

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::clearBufferuiv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,deUint32 *value)

{
  bool bVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  ConstPixelBufferAccess *pCVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ConstPixelBufferAccess *pCVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  MultisamplePixelBufferAccess access;
  Vector<int,_4> res;
  MultisamplePixelBufferAccess colorBuf;
  byte local_c9;
  byte local_c8;
  int local_c4;
  MultisampleConstPixelBufferAccess local_c0;
  ChannelOrder local_98 [4];
  undefined1 local_88 [16];
  IVec4 local_78;
  MultisamplePixelBufferAccess local_68;
  
  if (buffer != 0x1800) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (drawbuffer != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (this->m_scissorEnabled == true) {
    iVar9 = (this->m_scissorBox).m_data[0];
    local_c4 = (this->m_scissorBox).m_data[1];
    iVar11 = (this->m_scissorBox).m_data[2];
    iVar10 = (this->m_scissorBox).m_data[3];
  }
  else {
    local_c4 = 0;
    iVar10 = 0x7fffffff;
    iVar11 = 0x7fffffff;
    iVar9 = 0;
  }
  getDrawColorbuffer(&local_68,this);
  bVar1 = (this->m_colorMask).m_data[1];
  if ((this->m_colorMask).m_data[0] == true) {
    if ((bVar1 == false) || ((this->m_colorMask).m_data[2] != true)) goto LAB_018a2fa0;
    local_c9 = (this->m_colorMask).m_data[3] ^ 1;
  }
  else {
    if ((bVar1 == false) && ((this->m_colorMask).m_data[2] == false)) {
      local_c9 = 1;
      local_c8 = (this->m_colorMask).m_data[3] ^ 1;
      goto LAB_018a2fad;
    }
LAB_018a2fa0:
    local_c9 = 1;
  }
  local_c8 = 0;
LAB_018a2fad:
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_c0,&local_68);
  iVar5 = 0;
  if (0 < iVar9) {
    iVar5 = iVar9;
  }
  iVar7 = 0;
  if (0 < local_c4) {
    iVar7 = local_c4;
  }
  iVar2 = iVar11 + iVar9;
  if (local_c0.m_access.m_size.m_data[1] <= iVar11 + iVar9) {
    iVar2 = local_c0.m_access.m_size.m_data[1];
  }
  iVar9 = iVar10 + local_c4;
  if (local_c0.m_access.m_size.m_data[2] <= iVar10 + local_c4) {
    iVar9 = local_c0.m_access.m_size.m_data[2];
  }
  if (((0 < iVar2 - iVar5) && (0 < iVar9 - iVar7)) && (local_c8 == 0)) {
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_c0,&local_68,iVar5,iVar7,iVar2 - iVar5,
                     iVar9 - iVar7);
    local_88._0_4_ = value[0];
    local_88._4_4_ = value[1];
    local_88._8_8_ = *(undefined8 *)(value + 2);
    if (local_c9 == 0) {
      local_78.m_data._0_8_ = local_88._0_8_;
      local_78.m_data._8_8_ = local_88._8_8_;
      rr::clear((MultisamplePixelBufferAccess *)&local_c0,&local_78);
    }
    else if (0 < local_c0.m_access.m_size.m_data[2]) {
      iVar10 = 0;
      iVar9 = local_c0.m_access.m_size.m_data[2];
      iVar11 = local_c0.m_access.m_size.m_data[1];
      do {
        if (0 < iVar11) {
          iVar7 = 0;
          iVar5 = local_c0.m_access.m_size.m_data[0];
          do {
            if (0 < iVar5) {
              iVar9 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_c0,iVar9,
                           iVar7);
                local_98[0] = 0;
                local_98[1] = 0;
                local_98[2] = 0;
                local_98[3] = 0;
                pCVar3 = (ConstPixelBufferAccess *)local_88;
                lVar6 = 0;
                pCVar4 = (ConstPixelBufferAccess *)&stack0xffffffffffffffc0;
                do {
                  pCVar8 = pCVar4;
                  if ((this->m_colorMask).m_data[lVar6] != false) {
                    pCVar8 = pCVar3;
                  }
                  local_98[lVar6] = (pCVar8->m_format).order;
                  lVar6 = lVar6 + 1;
                  pCVar4 = (ConstPixelBufferAccess *)&(pCVar4->m_format).type;
                  pCVar3 = (ConstPixelBufferAccess *)&(pCVar3->m_format).type;
                } while (lVar6 != 4);
                local_78.m_data[0] = local_98[0];
                local_78.m_data[1] = local_98[1];
                local_78.m_data[2] = local_98[2];
                local_78.m_data[3] = local_98[3];
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&local_c0,&local_78,iVar9,iVar7,iVar10);
                iVar9 = iVar9 + 1;
                iVar11 = local_c0.m_access.m_size.m_data[1];
                iVar5 = local_c0.m_access.m_size.m_data[0];
              } while (iVar9 < local_c0.m_access.m_size.m_data[0]);
            }
            iVar7 = iVar7 + 1;
            iVar9 = local_c0.m_access.m_size.m_data[2];
          } while (iVar7 < iVar11);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferuiv (deUint32 buffer, int drawbuffer, const deUint32* value)
{
	RC_IF_ERROR(buffer != GL_COLOR, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	TCU_CHECK_INTERNAL(buffer == GL_COLOR);
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			tcu::UVec4							color		(value[0], value[1], value[2], value[3]);

			if (!maskUsed)
				rr::clear(access, color.asInt());
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixelUint(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
}